

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O1

printer * __thiscall
boost::ext::ut::v1_1_8::printer::operator<<
          (printer *this,eq_<double,_boost::ext::ut::v1_1_8::detail::integral_constant<2>_> *op)

{
  undefined1 *this_00;
  size_t local_38;
  char *pcStack_30;
  size_t local_28;
  char *pcStack_20;
  
  local_38 = (this->colors_).fail._M_len;
  pcStack_30 = (this->colors_).fail._M_str;
  local_28 = (this->colors_).pass._M_len;
  pcStack_20 = (this->colors_).pass._M_str;
  this_00 = &this->field_0x40;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(&pcStack_30)[(ulong)op->value_ * 2],
             (&local_38)[(ulong)op->value_ * 2]);
  std::ostream::_M_insert<double>(op->lhs_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," == ",4);
  std::ostream::operator<<((ostream *)this_00,2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->colors_).none._M_str,(this->colors_).none._M_len);
  return this;
}

Assistant:

auto& operator<<(const detail::eq_<TLhs, TRhs>& op) {
      return (*this << color(op) << op.lhs() << " == " << op.rhs()
                    << colors_.none);
    }